

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

uint64_t Catch::getEstimatedClockResolution(void)

{
  int iVar1;
  
  if (getEstimatedClockResolution()::s_resolution == '\0') {
    iVar1 = __cxa_guard_acquire(&getEstimatedClockResolution()::s_resolution);
    if (iVar1 != 0) {
      getEstimatedClockResolution::s_resolution = anon_unknown_1::estimateClockResolution();
      __cxa_guard_release(&getEstimatedClockResolution()::s_resolution);
    }
  }
  return getEstimatedClockResolution::s_resolution;
}

Assistant:

auto getEstimatedClockResolution() -> uint64_t {
        static auto s_resolution = estimateClockResolution();
        return s_resolution;
    }